

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::DrawNetWeb(BoardView *this,ImDrawList *draw)

{
  element_type *peVar1;
  long lVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  ImU32 IVar4;
  undefined4 extraout_var;
  bool bVar5;
  long *plVar6;
  shared_ptr<Pin> *p;
  long *plVar7;
  long lVar8;
  ImVec4 local_58;
  long *local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  
  if (this->showNetWeb == true) {
    peVar1 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((1 < *(uint *)&(peVar1->super_BoardElement).field_0xc) && (peVar1->net->is_ground == false))
    {
      iVar3 = (*this->m_board->_vptr_Board[4])();
      plVar7 = *(long **)CONCAT44(extraout_var,iVar3);
      plVar6 = (long *)((long *)CONCAT44(extraout_var,iVar3))[1];
      local_48 = plVar6;
      if (plVar7 != plVar6) {
        do {
          lVar8 = *plVar7;
          if (*(Net **)(lVar8 + 0x60) ==
              ((this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              net) {
            IVar4 = (this->m_colors).pinNetWebColor;
            lVar2 = *(long *)(lVar8 + 0x68);
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar8 + 0x70);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            if (lVar2 == 0) {
              bVar5 = true;
            }
            else {
              iVar3 = *(int *)(lVar2 + 8);
              bVar5 = iVar3 == 2 || iVar3 == this->m_current_side;
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            lVar8 = *plVar7;
            if (!bVar5) {
              IVar4 = (this->m_colors).pinNetWebOSColor;
              local_58._0_8_ =
                   CoordToScreen(this,*(float *)(lVar8 + 0x50),*(float *)(lVar8 + 0x54),1.0);
              ImDrawList::AddCircle
                        (draw,(ImVec2 *)&local_58,*(float *)(lVar8 + 0x58) * this->m_scale,IVar4,
                         0x10,1.0);
              lVar8 = *plVar7;
            }
            peVar1 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            local_38 = CoordToScreen(this,(peVar1->position).x,(peVar1->position).y,1.0);
            local_40 = CoordToScreen(this,*(float *)(lVar8 + 0x50),*(float *)(lVar8 + 0x54),1.0);
            local_58.y = (float)(IVar4 >> 8 & 0xff) * 0.003921569;
            local_58.x = (float)(IVar4 & 0xff) * 0.003921569;
            local_58.z = (float)(IVar4 >> 0x10 & 0xff) * 0.003921569;
            local_58.w = (float)(IVar4 >> 0x18) * 0.003921569;
            IVar4 = ImGui::ColorConvertFloat4ToU32(&local_58);
            ImDrawList::AddLine(draw,&local_38,&local_40,IVar4,(float)this->netWebThickness);
            plVar6 = local_48;
          }
          plVar7 = plVar7 + 2;
        } while (plVar7 != plVar6);
      }
    }
  }
  return;
}

Assistant:

void BoardView::DrawNetWeb(ImDrawList *draw) {
	if (!showNetWeb) return;

	/*
	 * Some nets we don't bother showing, because they're not relevant or
	 * produce too many results (such as ground!)
	 */
	if (m_pinSelected->type == Pin::kPinTypeNotConnected) return;
	if (m_pinSelected->type == Pin::kPinTypeUnkown) return;
	if (m_pinSelected->net->is_ground) return;

	for (auto &p : m_board->Pins()) {

		if (p->net == m_pinSelected->net) {
			uint32_t col = m_colors.pinNetWebColor;
			if (!BoardElementIsVisible(p->component)) {
				col = m_colors.pinNetWebOSColor;
				draw->AddCircle(CoordToScreen(p->position.x, p->position.y), p->diameter * m_scale, col, 16);
			}

			draw->AddLine(CoordToScreen(m_pinSelected->position.x, m_pinSelected->position.y),
			              CoordToScreen(p->position.x, p->position.y),
			              ImColor(col),
			              netWebThickness);
		}
	}

	return;
}